

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

bool __thiscall kws::Parser::IsInAnyComments(Parser *this,size_t pos)

{
  ulong uVar1;
  ulong uVar2;
  string *psVar3;
  
  psVar3 = &this->m_Buffer;
  uVar1 = std::__cxx11::string::find((char *)psVar3,0x16b53a,0);
  if (uVar1 == 0xffffffffffffffff) {
    uVar2 = 0xffffffffffffffff;
  }
  else {
    uVar2 = std::__cxx11::string::find((char *)psVar3,0x16b512,uVar1);
  }
  while (uVar2 != 0xffffffffffffffff) {
    if (uVar1 <= pos && pos <= uVar2) {
      return true;
    }
    uVar1 = std::__cxx11::string::find((char *)psVar3,0x16b53a,uVar2 + 1);
    if (uVar1 == 0xffffffffffffffff) {
      uVar2 = 0xffffffffffffffff;
    }
    else {
      uVar2 = std::__cxx11::string::find((char *)psVar3,0x16b512,uVar1);
    }
  }
  uVar1 = std::__cxx11::string::find((char *)psVar3,0x16b53d,0);
  if (uVar1 == 0xffffffffffffffff) {
    uVar2 = 0xffffffffffffffff;
  }
  else {
    uVar2 = std::__cxx11::string::find((char *)psVar3,0x16b540,uVar1);
  }
  while( true ) {
    if (uVar2 == 0xffffffffffffffff) {
      return uVar2 != 0xffffffffffffffff;
    }
    if (pos <= uVar2 && uVar1 <= pos) break;
    uVar1 = std::__cxx11::string::find((char *)psVar3,0x16b53d,uVar2 + 1);
    if (uVar1 == 0xffffffffffffffff) {
      uVar2 = 0xffffffffffffffff;
    }
    else {
      uVar2 = std::__cxx11::string::find((char *)psVar3,0x16b540,uVar1);
    }
  }
  return true;
}

Assistant:

bool Parser::IsInAnyComments(size_t pos) const
{
  //Check //
  size_t posslash = m_Buffer.find("//",0);
  size_t posend = std::string::npos;
  if(posslash != std::string::npos)
    {
    posend = m_Buffer.find("\n",posslash);
    }

  while(posend != std::string::npos)
    {
    if(pos<=posend && pos>=posslash)
      {
      return true;
      }
    posslash = m_Buffer.find("//",posend+1);
    if(posslash != std::string::npos)
      {
      posend = m_Buffer.find("\n",posslash);
      }
    else
      {
      posend = std::string::npos;
      }
    }

  // Check the /* */
  size_t posstart = m_Buffer.find("/*",0);
  posend = std::string::npos;
  if(posstart != std::string::npos)
    {
    posend = m_Buffer.find("*/",posstart);
    }

  while(posend != std::string::npos)
    {
    if(pos<=posend && pos>=posstart)
      {
      return true;
      }
    posstart = m_Buffer.find("/*",posend+1);
    if(posstart != std::string::npos)
      {
      posend = m_Buffer.find("*/",posstart);
      }
    else
      {
      posend = std::string::npos;
      }
    }
  return false;
}